

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O1

void __thiscall
helics::CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker>::~CommsBroker
          (CommsBroker<helics::inproc::InprocComms,_helics::CoreBroker> *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  bool bVar5;
  timespec local_30;
  
  (this->super_CoreBroker).super_Broker._vptr_Broker = (_func_int **)&PTR__CommsBroker_0056f4f0;
  (this->super_CoreBroker).super_BrokerBase._vptr_BrokerBase =
       (_func_int **)&PTR__CommsBroker_0056f648;
  LOCK();
  (this->super_CoreBroker).super_BrokerBase.haltOperations._M_base._M_i = true;
  UNLOCK();
  LOCK();
  iVar1 = (this->disconnectionStage).super___atomic_base<int>._M_i;
  bVar5 = iVar1 == 2;
  if (bVar5) {
    (this->disconnectionStage).super___atomic_base<int>._M_i = 3;
    iVar1 = 2;
  }
  UNLOCK();
  if (!bVar5) {
    do {
      if (iVar1 == 0) {
        LOCK();
        bVar5 = (this->disconnectionStage).super___atomic_base<int>._M_i == 0;
        if (bVar5) {
          (this->disconnectionStage).super___atomic_base<int>._M_i = 1;
        }
        UNLOCK();
        iVar4 = 1;
        if (bVar5) {
          CommsInterface::disconnect
                    (&((this->comms)._M_t.
                       super___uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
                       .super__Head_base<0UL,_helics::inproc::InprocComms_*,_false>._M_head_impl)->
                      super_CommsInterface);
          LOCK();
          (this->disconnectionStage).super___atomic_base<int>._M_i = 2;
          UNLOCK();
        }
      }
      else {
        local_30.tv_sec = 0;
        local_30.tv_nsec = 50000000;
        do {
          iVar2 = nanosleep(&local_30,&local_30);
          iVar4 = iVar1;
          if (iVar2 != -1) break;
          piVar3 = __errno_location();
        } while (*piVar3 == 4);
      }
      LOCK();
      iVar1 = (this->disconnectionStage).super___atomic_base<int>._M_i;
      bVar5 = iVar4 == iVar1;
      if (bVar5) {
        (this->disconnectionStage).super___atomic_base<int>._M_i = 3;
        iVar1 = iVar4;
      }
      UNLOCK();
    } while (!bVar5);
  }
  std::
  __uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>::
  reset((__uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
         *)&this->comms,(pointer)0x0);
  BrokerBase::joinAllThreads(&(this->super_CoreBroker).super_BrokerBase);
  std::unique_ptr<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>::
  ~unique_ptr(&this->comms);
  CoreBroker::~CoreBroker(&this->super_CoreBroker);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::~CommsBroker()
{
    BrokerBase::haltOperations = true;
    int exp = 2;
    while (!disconnectionStage.compare_exchange_weak(exp, 3)) {
        if (exp == 0) {
            commDisconnect();
            exp = 1;
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(50));
        }
    }
    comms = nullptr;  // need to ensure the comms are deleted before the callbacks become invalid
    BrokerBase::joinAllThreads();
}